

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmt_header.cc
# Opt level: O1

FMTHeader * wave::MakeFMTHeader(void)

{
  FMTHeader *header;
  FMTHeader *in_RDI;
  
  builtin_strncpy(in_RDI->sub_chunk_1_id,"fmt ",4);
  in_RDI->sub_chunk_1_size = 0x10;
  in_RDI->audio_format = 1;
  in_RDI->num_channel = 1;
  in_RDI->sample_rate = 0xac44;
  in_RDI->byte_rate = 0x15888;
  in_RDI->byte_per_block = 2;
  in_RDI->bits_per_sample = 0x10;
  return in_RDI;
}

Assistant:

FMTHeader MakeFMTHeader() {
  FMTHeader header;
  strncpy(header.sub_chunk_1_id, "fmt ", 4);
  header.sub_chunk_1_size = 16;
  // default values
  header.audio_format = 1;  // PCM
  header.num_channel = 1;
  header.sample_rate = 44100;
  header.bits_per_sample = 16;
  header.byte_per_block = (header.bits_per_sample * header.num_channel) / 8;
  header.byte_rate = header.byte_per_block * header.sample_rate;
  return header;
}